

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall Js::FunctionBody::IsGeneratorAndJitIsDisabled(FunctionBody *this)

{
  byte bVar1;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  
  pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar6 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_0075a2b3;
    *puVar5 = 0;
    pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(pFVar6->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar4) goto LAB_0075a2b3;
    *puVar5 = 0;
    pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((pFVar6->attributes & (Async|Generator)) == None) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (((DAT_01599228 == '\x01') &&
        (((this->super_ParseableFunctionInfo).flags & Flags_HasTry) == Flags_None)) &&
       (pUVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,
       bVar1 = pUVar2->field_0xa8,
       (byte)((bVar1 >> 5 | (pUVar2->debugModeSource).ptr != (uchar *)0x0) & (bVar1 & 0x40) >> 6) ==
       0)) {
      if ((FunctionBody *)(pFVar6->functionBodyImpl).ptr != this) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x57e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                    "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar4) {
LAB_0075a2b3:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
        pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar4 = (bool)((*(byte *)((long)&pFVar6->attributes + 2) & 2) >> 1);
    }
  }
  return bVar4;
}

Assistant:

bool
    FunctionBody::IsGeneratorAndJitIsDisabled() const
    {
        return this->IsCoroutine() && !(CONFIG_FLAG(JitES6Generators) && !this->GetHasTry() && !this->IsInDebugMode() && !this->IsModule());
    }